

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_parse_in(ly_ctx *ctx,ly_in *in,LYS_INFORMAT format,
                   _func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr *custom_check
                   ,void *check_data,ly_set *new_mods,lys_module **module)

{
  bool bVar1;
  int iVar2;
  ly_err_item *plVar3;
  lysp_revision *local_e0;
  char *local_c0;
  ly_err_item *e;
  undefined1 auStack_98 [7];
  ly_bool module_created;
  lysf_ctx fctx;
  lysp_ctx *pctx;
  lysp_yin_ctx *yinctx;
  lysp_yang_ctx *yangctx;
  lys_module *plStack_58;
  LY_ERR ret;
  lys_module *mod_dup;
  lys_module *latest;
  lys_module *mod;
  ly_set *new_mods_local;
  void *check_data_local;
  _func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr *custom_check_local;
  ly_in *plStack_20;
  LYS_INFORMAT format_local;
  ly_in *in_local;
  ly_ctx *ctx_local;
  
  latest = (lys_module *)0x0;
  plStack_58 = (lys_module *)0x0;
  yinctx = (lysp_yin_ctx *)0x0;
  pctx = (lysp_ctx *)0x0;
  fctx.ext_set.field_2.dnodes = (lyd_node **)0x0;
  mod = (lys_module *)new_mods;
  new_mods_local = (ly_set *)check_data;
  check_data_local = custom_check;
  custom_check_local._4_4_ = format;
  plStack_20 = in;
  in_local = (ly_in *)ctx;
  memset(auStack_98,0,0x20);
  _auStack_98 = (ly_ctx *)in_local;
  bVar1 = false;
  if (((in_local == (ly_in *)0x0) || (plStack_20 == (ly_in *)0x0)) || (mod == (lys_module *)0x0)) {
    __assert_fail("ctx && in && new_mods",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                  ,0x721,
                  "LY_ERR lys_parse_in(struct ly_ctx *, struct ly_in *, LYS_INFORMAT, LY_ERR (*)(const struct ly_ctx *, struct lysp_module *, struct lysp_submodule *, void *), void *, struct ly_set *, struct lys_module **)"
                 );
  }
  if (module != (lys_module **)0x0) {
    *module = (lys_module *)0x0;
  }
  latest = (lys_module *)calloc(1,0x80);
  if (latest == (lys_module *)0x0) {
    ly_log((ly_ctx *)in_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_parse_in");
    return LY_EMEM;
  }
  latest->ctx = (ly_ctx *)in_local;
  if (custom_check_local._4_4_ == LYS_IN_YANG) {
    yangctx._4_4_ = yang_parse_module((lysp_yang_ctx **)&yinctx,plStack_20,latest);
    fctx.ext_set.field_2.dnodes = (lyd_node **)yinctx;
  }
  else if (custom_check_local._4_4_ == LYS_IN_YIN) {
    yangctx._4_4_ = yin_parse_module((lysp_yin_ctx **)&pctx,plStack_20,latest);
    fctx.ext_set.field_2.dnodes = (lyd_node **)pctx;
  }
  else {
    ly_log((ly_ctx *)in_local,LY_LLERR,LY_EINVAL,"Invalid schema input format.");
    yangctx._4_4_ = LY_EINVAL;
  }
  if ((yangctx._4_4_ == LY_SUCCESS) &&
     ((lysp_sort_revisions(latest->parsed->revs), latest->parsed->revs == (lysp_revision *)0x0 ||
      (yangctx._4_4_ =
            lydict_insert((ly_ctx *)in_local,latest->parsed->revs->date,0,&latest->revision),
      yangctx._4_4_ == LY_SUCCESS)))) {
    mod_dup = ly_ctx_get_module_latest((ly_ctx *)in_local,latest->name);
    if (mod_dup == (lys_module *)0x0) {
      latest->latest_revision = '\x01';
    }
    else if (latest->revision == (char *)0x0) {
      mod_dup = (lys_module *)0x0;
    }
    else if (mod_dup->revision == (char *)0x0) {
      latest->latest_revision = mod_dup->latest_revision & 3;
    }
    else {
      iVar2 = strcmp(latest->revision,mod_dup->revision);
      if (iVar2 < 1) {
        mod_dup = (lys_module *)0x0;
      }
      else {
        latest->latest_revision = mod_dup->latest_revision & 3;
      }
    }
    if ((check_data_local == (void *)0x0) ||
       (yangctx._4_4_ = (*(code *)check_data_local)(in_local,latest->parsed,0,new_mods_local),
       yangctx._4_4_ == LY_SUCCESS)) {
      plStack_58 = ly_ctx_get_module((ly_ctx *)in_local,latest->name,latest->revision);
      if (plStack_58 == (lys_module *)0x0) {
        plStack_58 = ly_ctx_get_module_latest_ns((ly_ctx *)in_local,latest->ns);
        if ((plStack_58 == (lys_module *)0x0) || (plStack_58->revision != latest->revision)) {
          switch(plStack_20->type) {
          case LY_IN_FD:
          case LY_IN_FILE:
          case LY_IN_MEMORY:
            break;
          case LY_IN_FILEPATH:
            if (latest->parsed->revs == (lysp_revision *)0x0) {
              local_e0 = (lysp_revision *)0x0;
            }
            else {
              local_e0 = latest->parsed->revs;
            }
            ly_check_module_filename
                      ((ly_ctx *)in_local,latest->name,local_e0->date,
                       (plStack_20->method).fpath.filepath);
            break;
          case LY_IN_ERROR:
            ly_log((ly_ctx *)in_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                   ,0x777);
            yangctx._4_4_ = LY_EINT;
            goto LAB_00190d81;
          }
          lys_parser_fill_filepath((ly_ctx *)in_local,plStack_20,&latest->filepath);
          if (mod_dup != (lys_module *)0x0) {
            mod_dup->latest_revision = mod_dup->latest_revision & 0xfc;
          }
          iVar2 = strcmp(latest->name,"ietf-netconf");
          if (iVar2 == 0) {
            yangctx._4_4_ =
                 lysp_add_internal_ietf_netconf
                           ((lysp_ctx *)fctx.ext_set.field_2.dnodes,latest->parsed);
            if (yangctx._4_4_ != LY_SUCCESS) goto LAB_00190d81;
            yangctx._4_4_ = LY_SUCCESS;
          }
          else {
            iVar2 = strcmp(latest->name,"ietf-netconf-with-defaults");
            if (iVar2 == 0) {
              yangctx._4_4_ =
                   lysp_add_internal_ietf_netconf_with_defaults
                             ((lysp_ctx *)fctx.ext_set.field_2.dnodes,latest->parsed);
              if (yangctx._4_4_ != LY_SUCCESS) goto LAB_00190d81;
              yangctx._4_4_ = LY_SUCCESS;
            }
            else {
              iVar2 = strcmp(latest->name,"yang");
              if (iVar2 == 0) {
                yangctx._4_4_ =
                     lysp_add_internal_yang((lysp_ctx *)fctx.ext_set.field_2.dnodes,latest->parsed);
                if (yangctx._4_4_ != LY_SUCCESS) goto LAB_00190d81;
                yangctx._4_4_ = LY_SUCCESS;
              }
            }
          }
          yangctx._4_4_ = ly_set_add((ly_set *)mod,latest,'\x01',(uint32_t *)0x0);
          if (yangctx._4_4_ == LY_SUCCESS) {
            bVar1 = true;
            yangctx._4_4_ = ly_set_add((ly_set *)(in_local + 1),latest,'\x01',(uint32_t *)0x0);
            if (yangctx._4_4_ == LY_SUCCESS) {
              *(undefined2 *)&in_local[4].type = (short)in_local[4].type + LY_IN_FILE;
              yangctx._4_4_ =
                   lysp_resolve_import_include
                             ((lysp_ctx *)fctx.ext_set.field_2.dnodes,latest->parsed,(ly_set *)mod);
              if (((((yangctx._4_4_ == LY_SUCCESS) &&
                    (yangctx._4_4_ =
                          lysp_resolve_ext_instance_records((lysp_ctx *)fctx.ext_set.field_2.dnodes)
                    , yangctx._4_4_ == LY_SUCCESS)) &&
                   (yangctx._4_4_ =
                         lysp_check_dup_typedefs
                                   ((lysp_ctx *)fctx.ext_set.field_2.dnodes,latest->parsed),
                   yangctx._4_4_ == LY_SUCCESS)) &&
                  ((yangctx._4_4_ =
                         lysp_check_dup_groupings
                                   ((lysp_ctx *)fctx.ext_set.field_2.dnodes,latest->parsed),
                   yangctx._4_4_ == LY_SUCCESS &&
                   (yangctx._4_4_ =
                         lysp_check_dup_features
                                   ((lysp_ctx *)fctx.ext_set.field_2.dnodes,latest->parsed),
                   yangctx._4_4_ == LY_SUCCESS)))) &&
                 ((yangctx._4_4_ =
                        lysp_check_dup_identities
                                  ((lysp_ctx *)fctx.ext_set.field_2.dnodes,latest->parsed),
                  yangctx._4_4_ == LY_SUCCESS &&
                  (yangctx._4_4_ = lys_compile_feature_iffeatures(latest->parsed),
                  yangctx._4_4_ == LY_SUCCESS)))) {
                yangctx._4_4_ = lys_compile_identities(latest);
              }
            }
          }
        }
        else {
          ly_log((ly_ctx *)in_local,LY_LLERR,LY_EINVAL,
                 "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
                 plStack_58->name,latest->name,latest->ns);
          yangctx._4_4_ = LY_EINVAL;
        }
      }
      else {
        if (plStack_58->revision == (char *)0x0) {
          local_c0 = "<none>";
        }
        else {
          local_c0 = plStack_58->revision;
        }
        ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
               "Module \"%s@%s\" is already present in the context.",plStack_58->name,local_c0);
      }
    }
  }
LAB_00190d81:
  if ((((yangctx._4_4_ != LY_SUCCESS) && (yangctx._4_4_ != LY_EEXIST)) &&
      ((latest != (lys_module *)0x0 &&
       ((latest->name != (char *)0x0 &&
        (plVar3 = ly_err_last((ly_ctx *)in_local), plVar3 != (ly_err_item *)0x0)))))) &&
     ((plVar3->schema_path == (char *)0x0 || (plVar3->line != 0)))) {
    ly_log((ly_ctx *)in_local,LY_LLERR,LY_EOTHER,"Parsing module \"%s\" failed.",latest->name);
  }
  if (!bVar1) {
    fctx.ctx = (ly_ctx *)latest;
    lys_module_free((lysf_ctx *)auStack_98,latest,'\0');
    lysf_ctx_erase((lysf_ctx *)auStack_98);
    latest = plStack_58;
  }
  if (custom_check_local._4_4_ == LYS_IN_YANG) {
    lysp_yang_ctx_free((lysp_yang_ctx *)yinctx);
  }
  else {
    lysp_yin_ctx_free((lysp_yin_ctx *)pctx);
  }
  if ((yangctx._4_4_ == LY_SUCCESS) && (module != (lys_module **)0x0)) {
    *module = latest;
  }
  return yangctx._4_4_;
}

Assistant:

LY_ERR
lys_parse_in(struct ly_ctx *ctx, struct ly_in *in, LYS_INFORMAT format,
        LY_ERR (*custom_check)(const struct ly_ctx *ctx, struct lysp_module *mod, struct lysp_submodule *submod, void *data),
        void *check_data, struct ly_set *new_mods, struct lys_module **module)
{
    struct lys_module *mod = NULL, *latest, *mod_dup = NULL;
    LY_ERR ret;
    struct lysp_yang_ctx *yangctx = NULL;
    struct lysp_yin_ctx *yinctx = NULL;
    struct lysp_ctx *pctx = NULL;
    struct lysf_ctx fctx = {.ctx = ctx};
    ly_bool module_created = 0;

    assert(ctx && in && new_mods);

    if (module) {
        *module = NULL;
    }

    mod = calloc(1, sizeof *mod);
    LY_CHECK_ERR_RET(!mod, LOGMEM(ctx), LY_EMEM);
    mod->ctx = ctx;

    /* parse */
    switch (format) {
    case LYS_IN_YIN:
        ret = yin_parse_module(&yinctx, in, mod);
        pctx = (struct lysp_ctx *)yinctx;
        break;
    case LYS_IN_YANG:
        ret = yang_parse_module(&yangctx, in, mod);
        pctx = (struct lysp_ctx *)yangctx;
        break;
    default:
        LOGERR(ctx, LY_EINVAL, "Invalid schema input format.");
        ret = LY_EINVAL;
        break;
    }
    LY_CHECK_GOTO(ret, cleanup);

    /* make sure that the newest revision is at position 0 */
    lysp_sort_revisions(mod->parsed->revs);
    if (mod->parsed->revs) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, mod->parsed->revs[0].date, 0, &mod->revision), cleanup);
    }

    /* decide the latest revision */
    latest = ly_ctx_get_module_latest(ctx, mod->name);
    if (latest) {
        if (mod->revision) {
            if (!latest->revision) {
                /* latest has no revision, so mod is anyway newer */
                mod->latest_revision = latest->latest_revision & (LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
                /* the latest is zeroed later when the new module is being inserted into the context */
            } else if (strcmp(mod->revision, latest->revision) > 0) {
                mod->latest_revision = latest->latest_revision & (LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
                /* the latest is zeroed later when the new module is being inserted into the context */
            } else {
                latest = NULL;
            }
        } else {
            latest = NULL;
        }
    } else {
        mod->latest_revision = LYS_MOD_LATEST_REV;
    }

    if (custom_check) {
        LY_CHECK_GOTO(ret = custom_check(ctx, mod->parsed, NULL, check_data), cleanup);
    }

    /* check whether it is not already in the context in the same revision */
    mod_dup = ly_ctx_get_module(ctx, mod->name, mod->revision);
    if (mod_dup) {
        /* nothing to do */
        LOGVRB("Module \"%s@%s\" is already present in the context.", mod_dup->name,
                mod_dup->revision ? mod_dup->revision : "<none>");
        goto cleanup;
    }

    /* check whether there is not a namespace collision */
    mod_dup = ly_ctx_get_module_latest_ns(ctx, mod->ns);
    if (mod_dup && (mod_dup->revision == mod->revision)) {
        LOGERR(ctx, LY_EINVAL, "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
                mod_dup->name, mod->name, mod->ns);
        ret = LY_EINVAL;
        goto cleanup;
    }

    switch (in->type) {
    case LY_IN_FILEPATH:
        ly_check_module_filename(ctx, mod->name, mod->parsed->revs ? mod->parsed->revs[0].date : NULL, in->method.fpath.filepath);
        break;
    case LY_IN_FD:
    case LY_IN_FILE:
    case LY_IN_MEMORY:
        /* nothing special to do */
        break;
    case LY_IN_ERROR:
        LOGINT(ctx);
        ret = LY_EINT;
        goto cleanup;
    }
    lys_parser_fill_filepath(ctx, in, &mod->filepath);

    if (latest) {
        latest->latest_revision &= ~(LYS_MOD_LATEST_REV | LYS_MOD_LATEST_SEARCHDIRS);
    }

    /* add internal data in case specific modules were parsed */
    if (!strcmp(mod->name, "ietf-netconf")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_ietf_netconf(pctx, mod->parsed), cleanup);
    } else if (!strcmp(mod->name, "ietf-netconf-with-defaults")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_ietf_netconf_with_defaults(pctx, mod->parsed), cleanup);
    } else if (!strcmp(mod->name, "yang")) {
        LY_CHECK_GOTO(ret = lysp_add_internal_yang(pctx, mod->parsed), cleanup);
    }

    /* add the module into newly created module set, will also be freed from there on any error */
    LY_CHECK_GOTO(ret = ly_set_add(new_mods, mod, 1, NULL), cleanup);
    module_created = 1;

    /* add into context */
    ret = ly_set_add(&ctx->list, mod, 1, NULL);
    LY_CHECK_GOTO(ret, cleanup);
    ctx->change_count++;

    /* resolve includes and all imports */
    LY_CHECK_GOTO(ret = lysp_resolve_import_include(pctx, mod->parsed, new_mods), cleanup);

    /* resolve extension instance plugin records */
    LY_CHECK_GOTO(ret = lysp_resolve_ext_instance_records(pctx), cleanup);

    /* check name collisions */
    LY_CHECK_GOTO(ret = lysp_check_dup_typedefs(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_groupings(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_features(pctx, mod->parsed), cleanup);
    LY_CHECK_GOTO(ret = lysp_check_dup_identities(pctx, mod->parsed), cleanup);

    /* compile features */
    LY_CHECK_GOTO(ret = lys_compile_feature_iffeatures(mod->parsed), cleanup);

    /* compile identities */
    LY_CHECK_GOTO(ret = lys_compile_identities(mod), cleanup);

cleanup:
    if (ret && (ret != LY_EEXIST)) {
        if (mod && mod->name) {
            /* there are cases when path is not available for parsing error, so this additional
             * message tries to add information about the module where the error occurred */
            const struct ly_err_item *e = ly_err_last(ctx);

            if (e && (!e->schema_path || e->line)) {
                LOGERR(ctx, LY_EOTHER, "Parsing module \"%s\" failed.", mod->name);
            }
        }
    }
    if (!module_created) {
        fctx.mod = mod;
        lys_module_free(&fctx, mod, 0);
        lysf_ctx_erase(&fctx);

        mod = mod_dup;
    }

    if (format == LYS_IN_YANG) {
        lysp_yang_ctx_free(yangctx);
    } else {
        lysp_yin_ctx_free(yinctx);
    }

    if (!ret && module) {
        *module = mod;
    }
    return ret;
}